

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

BOOL __thiscall
Js::SmallSpanSequence::GetMatchingStatementFromBytecode
          (SmallSpanSequence *this,int bytecode,SmallSpanSequenceIter *iter,StatementData *data)

{
  uint index;
  int iVar1;
  GrowingUint32HeapArray *pGVar2;
  code *pcVar3;
  uint uVar4;
  ulong in_RAX;
  undefined4 *puVar5;
  bool bVar6;
  undefined8 uStack_38;
  int countOfMissed;
  
  pGVar2 = this->pStatementBuffer;
  if (pGVar2 == (GrowingUint32HeapArray *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = pGVar2->count != 0;
  }
  if ((bytecode < 0) || (!bVar6)) goto LAB_0076ec49;
  if ((bytecode < iter->accumulatedBytecodeBegin) || (iter->accumulatedIndex < 1)) {
LAB_0076eb5d:
    iter->accumulatedIndex = 0;
    iter->accumulatedSourceBegin = this->baseValue;
    iter->accumulatedBytecodeBegin = 0;
    iter->indexOfActualOffset = 0;
  }
  else {
    if (pGVar2 == (GrowingUint32HeapArray *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = pGVar2->count;
    }
    if (uVar4 <= (uint)iter->accumulatedIndex) goto LAB_0076eb5d;
  }
  uStack_38 = in_RAX;
  while( true ) {
    if (this->pStatementBuffer == (GrowingUint32HeapArray *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = this->pStatementBuffer->count;
    }
    index = iter->accumulatedIndex;
    if (uVar4 <= index) break;
    uStack_38 = uStack_38 & 0xffffffff;
    GetRangeAt(this,index,iter,(int *)((long)&uStack_38 + 4),data);
    iVar1 = data->bytecodeBegin;
    if (iVar1 < bytecode) {
      iter->accumulatedSourceBegin = data->sourceBegin;
      iter->accumulatedBytecodeBegin = iVar1;
      iter->accumulatedIndex = iter->accumulatedIndex + 1;
      if (uStack_38._4_4_ != 0) {
        iter->indexOfActualOffset = iter->indexOfActualOffset + uStack_38._4_4_;
      }
    }
    else if (bytecode < iVar1) {
      data->sourceBegin = iter->accumulatedSourceBegin;
      data->bytecodeBegin = iter->accumulatedBytecodeBegin;
    }
    if (bytecode <= iVar1) {
      return 1;
    }
  }
  if (index != 0xffffffff) {
    if (data->bytecodeBegin < bytecode) {
      return 1;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x15b2,"(data.bytecodeBegin < bytecode)",
                                "data.bytecodeBegin < bytecode");
    if (bVar6) {
      *puVar5 = 0;
      return 1;
    }
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
LAB_0076ec49:
  iter->accumulatedIndex = -1;
  return 0;
}

Assistant:

BOOL SmallSpanSequence::GetMatchingStatementFromBytecode(int bytecode, SmallSpanSequenceIter &iter, StatementData & data)
    {
        if (Count() > 0 && bytecode >= 0)
        {
            // Support only in forward direction
            if (bytecode < iter.accumulatedBytecodeBegin
                || iter.accumulatedIndex <= 0 || (uint32)iter.accumulatedIndex >= Count())
            {
                // re-initialize the accumulators
                Reset(iter);
            }

            while ((uint32)iter.accumulatedIndex < Count())
            {
                int countOfMissed = 0;
                if (!GetRangeAt(iter.accumulatedIndex, iter, &countOfMissed, data))
                {
                    Assert(FALSE);
                    break;
                }

                if (data.bytecodeBegin >= bytecode)
                {
                    if (data.bytecodeBegin > bytecode)
                    {
                        // Not exactly at the current bytecode, so it falls in between previous statement.
                        data.sourceBegin = iter.accumulatedSourceBegin;
                        data.bytecodeBegin = iter.accumulatedBytecodeBegin;
                    }

                    return TRUE;
                }

                // Look for the next
                iter.accumulatedSourceBegin = data.sourceBegin;
                iter.accumulatedBytecodeBegin = data.bytecodeBegin;
                iter.accumulatedIndex++;

                if (countOfMissed)
                {
                    iter.indexOfActualOffset += countOfMissed;
                }
            }

            if (iter.accumulatedIndex != -1)
            {
                // Give the last one.
                Assert(data.bytecodeBegin < bytecode);
                return TRUE;
            }
        }

        // Failed to give the correct one, init to default
        iter.accumulatedIndex = -1;
        return FALSE;
    }